

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O2

void __thiscall Lodtalk::ClassBuilder::finish(ClassBuilder *this)

{
  Ref<Lodtalk::Class> *this_00;
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  ObjectHeader *pOVar4;
  Class *pCVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar6;
  SmallIntegerValue SVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  
  pOVar4 = (ObjectHeader *)
           Array::basicNativeNew
                     (this->context,
                      (long)(this->instanceVariableNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->instanceVariableNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  this_00 = &this->clazz;
  pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
  (pCVar5->super_ClassDescription).instanceVariables.field_0.header = pOVar4;
  lVar10 = 0;
  uVar9 = 0;
  while( true ) {
    pbVar1 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar2 - (long)pbVar1 >> 5) <= uVar9) break;
    aVar6 = (anon_union_8_4_0eb573b0_for_Oop_0)
            ByteSymbol::fromNative
                      (this->context,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar10));
    pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
    uVar3 = (pCVar5->super_ClassDescription).instanceVariables.field_0.uintValue;
    lVar8 = uVar3 + 8;
    if ((uVar3 & 7) != 0) {
      lVar8 = 0;
    }
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar8 + uVar9 * 8) = aVar6;
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x20;
  }
  if (pbVar1 != pbVar2) {
    pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
    SVar7 = Oop::decodeSmallInteger
                      (&(pCVar5->super_ClassDescription).super_Behavior.fixedVariableCount);
    pbVar1 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
    (pCVar5->super_ClassDescription).super_Behavior.fixedVariableCount.field_0.pointer =
         (uint8_t *)((((long)pbVar1 - (long)pbVar2 >> 5) + SVar7) * 2 + 1);
    pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
    SVar7 = Oop::decodeSmallInteger(&(pCVar5->super_ClassDescription).super_Behavior.format);
    if (SVar7 == 0) {
      pCVar5 = Ref<Lodtalk::Class>::operator->(this_00);
      (pCVar5->super_ClassDescription).super_Behavior.format.field_0.uintValue = 3;
    }
  }
  createClassMethodDict(this);
  createMetaclassMethodDict(this);
  return;
}

Assistant:

void ClassBuilder::finish()
{
    clazz->instanceVariables = Oop::fromPointer(Array::basicNativeNew(context, instanceVariableNames.size()));
    for(size_t i = 0; i < instanceVariableNames.size(); ++i)
    {
        auto varNameSymbol = ByteSymbol::fromNative(context, instanceVariableNames[i]);
        auto array = reinterpret_cast<Oop*> (clazz->instanceVariables.getFirstFieldPointer());
        array[i] = varNameSymbol;
    }

    // Set the fixed variable count.
    if(!instanceVariableNames.empty())
    {
        clazz->fixedVariableCount = Oop::encodeSmallInteger(clazz->fixedVariableCount.decodeSmallInteger() + instanceVariableNames.size());
        if(clazz->format.decodeSmallInteger() == OF_EMPTY)
            clazz->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
    }

    createClassMethodDict();
    createMetaclassMethodDict();
}